

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TextFlow::AnsiSkippingString::AnsiSkippingString(AnsiSkippingString *this,string *text)

{
  string *in_RSI;
  string *in_RDI;
  AnsiSkippingString *in_stack_00000050;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  preprocessString(in_stack_00000050);
  return;
}

Assistant:

AnsiSkippingString::AnsiSkippingString( std::string const& text ):
            m_string( text ) {
            preprocessString();
        }